

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBlendTests.cpp
# Opt level: O0

int __thiscall deqp::gles3::Performance::BlendCase::init(BlendCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  MessageBuilder *pMVar2;
  AttribSpec *this_00;
  Enum<int,_2UL> EVar3;
  Vector<float,_4> local_a88;
  Vector<float,_4> local_a78;
  Vector<float,_4> local_a68;
  Vector<float,_4> local_a58;
  AttribSpec local_a48;
  GetNameFunc local_9e8;
  int local_9e0;
  Enum<int,_2UL> local_9d8;
  MessageBuilder local_9c8;
  GetNameFunc local_848;
  int local_840;
  Enum<int,_2UL> local_838;
  MessageBuilder local_828;
  GetNameFunc local_6a8;
  int local_6a0;
  Enum<int,_2UL> local_698;
  MessageBuilder local_688;
  GetNameFunc local_508;
  int local_500;
  Enum<int,_2UL> local_4f8;
  MessageBuilder local_4e8;
  GetNameFunc local_368;
  int local_360;
  Enum<int,_2UL> local_358;
  MessageBuilder local_348;
  GetNameFunc local_1c8;
  int local_1c0;
  Enum<int,_2UL> local_1b8 [2];
  MessageBuilder local_198;
  TestLog *local_18;
  TestLog *log;
  BlendCase *this_local;
  
  log = (TestLog *)this;
  local_18 = tcu::TestContext::getLog
                       ((this->super_ShaderPerformanceCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_198,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [10])"modeRGB: ");
  EVar3 = glu::getBlendEquationStr(this->m_modeRGB);
  local_1c8 = EVar3.m_getName;
  local_1c0 = EVar3.m_value;
  local_1b8[0].m_getName = local_1c8;
  local_1b8[0].m_value = local_1c0;
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1b8);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  tcu::TestLog::operator<<(&local_348,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_348,(char (*) [12])"modeAlpha: ");
  EVar3 = glu::getBlendEquationStr(this->m_modeAlpha);
  local_368 = EVar3.m_getName;
  local_360 = EVar3.m_value;
  local_358.m_getName = local_368;
  local_358.m_value = local_360;
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_358);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_348);
  tcu::TestLog::operator<<(&local_4e8,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_4e8,(char (*) [9])"srcRGB: ");
  EVar3 = glu::getBlendFactorStr(this->m_srcRGB);
  local_508 = EVar3.m_getName;
  local_500 = EVar3.m_value;
  local_4f8.m_getName = local_508;
  local_4f8.m_value = local_500;
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_4f8);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4e8);
  tcu::TestLog::operator<<(&local_688,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_688,(char (*) [9])"dstRGB: ");
  EVar3 = glu::getBlendFactorStr(this->m_dstRGB);
  local_6a8 = EVar3.m_getName;
  local_6a0 = EVar3.m_value;
  local_698.m_getName = local_6a8;
  local_698.m_value = local_6a0;
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_698);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_688);
  tcu::TestLog::operator<<(&local_828,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_828,(char (*) [11])"srcAlpha: ");
  EVar3 = glu::getBlendFactorStr(this->m_srcAlpha);
  local_848 = EVar3.m_getName;
  local_840 = EVar3.m_value;
  local_838.m_getName = local_848;
  local_838.m_value = local_840;
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_838);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_828);
  tcu::TestLog::operator<<(&local_9c8,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_9c8,(char (*) [11])"dstAlpha: ");
  EVar3 = glu::getBlendFactorStr(this->m_dstAlpha);
  local_9e8 = EVar3.m_getName;
  local_9e0 = EVar3.m_value;
  local_9d8.m_getName = local_9e8;
  local_9d8.m_value = local_9e0;
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_9d8);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_9c8);
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderPerformanceCase).m_vertShaderSource,
             "#version 300 es\nin highp vec4 a_position;\nin mediump vec4 a_color;\nout mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
            );
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderPerformanceCase).m_fragShaderSource,
             "#version 300 es\nin mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = v_color;\n}\n"
            );
  tcu::Vector<float,_4>::Vector(&local_a58,0.0,0.5,0.5,1.0);
  tcu::Vector<float,_4>::Vector(&local_a68,0.5,1.0,0.0,0.5);
  tcu::Vector<float,_4>::Vector(&local_a78,0.5,0.0,1.0,0.5);
  tcu::Vector<float,_4>::Vector(&local_a88,1.0,0.5,0.5,0.0);
  this_00 = &local_a48;
  deqp::gls::AttribSpec::AttribSpec(this_00,"a_color",&local_a58,&local_a68,&local_a78,&local_a88);
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::push_back
            (&(this->super_ShaderPerformanceCase).m_attributes,this_00);
  deqp::gls::AttribSpec::~AttribSpec(&local_a48);
  iVar1 = deqp::gls::ShaderPerformanceCase::init
                    (&this->super_ShaderPerformanceCase,(EVP_PKEY_CTX *)this_00);
  return iVar1;
}

Assistant:

void BlendCase::init (void)
{
	TestLog& log = m_testCtx.getLog();

	log << TestLog::Message << "modeRGB: " << glu::getBlendEquationStr(m_modeRGB) << TestLog::EndMessage;
	log << TestLog::Message << "modeAlpha: " << glu::getBlendEquationStr(m_modeAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "srcRGB: " << glu::getBlendFactorStr(m_srcRGB) << TestLog::EndMessage;
	log << TestLog::Message << "dstRGB: " << glu::getBlendFactorStr(m_dstRGB) << TestLog::EndMessage;
	log << TestLog::Message << "srcAlpha: " << glu::getBlendFactorStr(m_srcAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "dstAlpha: " << glu::getBlendFactorStr(m_dstAlpha) << TestLog::EndMessage;

	m_vertShaderSource =
		"#version 300 es\n"
		"in highp vec4 a_position;\n"
		"in mediump vec4 a_color;\n"
		"out mediump vec4 v_color;\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_color = a_color;\n"
		"}\n";
	m_fragShaderSource =
		"#version 300 es\n"
		"in mediump vec4 v_color;\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"void main (void)\n"
		"{\n"
		"	o_color = v_color;\n"
		"}\n";

	m_attributes.push_back(AttribSpec("a_color", Vec4(0.0f, 0.5f, 0.5f, 1.0f),
												 Vec4(0.5f, 1.0f, 0.0f, 0.5f),
												 Vec4(0.5f, 0.0f, 1.0f, 0.5f),
												 Vec4(1.0f, 0.5f, 0.5f, 0.0f)));

	ShaderPerformanceCase::init();
}